

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O0

int mpt_data_convert_int64(int64_t *from,mpt_type_t type,void *dest)

{
  undefined1 uVar1;
  char cVar2;
  ushort **ppuVar3;
  int iVar4;
  iovec *vec;
  int64_t val;
  void *dest_local;
  mpt_type_t type_local;
  int64_t *from_local;
  
  vec = (iovec *)0x0;
  if (from != (int64_t *)0x0) {
    vec = (iovec *)*from;
  }
  dest_local = (void *)type;
  if (type == 0x6c) {
    cVar2 = mpt_type_int(8);
    dest_local = (void *)(long)cVar2;
  }
  uVar1 = SUB81(vec,0);
  iVar4 = (int)vec;
  switch(dest_local) {
  case (void *)0x58:
    if (dest == (void *)0x0) {
      from_local._4_4_ = -0x10;
    }
    else {
      *(int64_t **)dest = from;
      *(undefined8 *)((long)dest + 8) = 8;
      from_local._4_4_ = 0x10;
    }
    break;
  default:
    from_local._4_4_ = -3;
    break;
  case (void *)0x62:
    if (((long)vec < -0x80) || (0x7f < (long)vec)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar1;
      }
      from_local._4_4_ = 1;
    }
    break;
  case (void *)0x63:
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[iVar4] & 0x8000) == 0) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar1;
      }
      from_local._4_4_ = 1;
    }
    break;
  case (void *)0x64:
    if (dest != (void *)0x0) {
      *(double *)dest = (double)(long)vec;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x65:
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)(long)vec;
    }
    from_local._4_4_ = 0x10;
    break;
  case (void *)0x66:
    if (dest != (void *)0x0) {
      *(float *)dest = (float)(long)vec;
    }
    from_local._4_4_ = 4;
    break;
  case (void *)0x69:
    if (((long)vec < -0x80000000) || (0x7fffffff < (long)vec)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(int *)dest = iVar4;
      }
      from_local._4_4_ = 4;
    }
    break;
  case (void *)0x6e:
    if (((long)vec < -0x8000) || (0x7fff < (long)vec)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(short *)dest = (short)vec;
      }
      from_local._4_4_ = 2;
    }
    break;
  case (void *)0x71:
    if (((long)vec < 0) || (0xffff < (long)vec)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(short *)dest = (short)vec;
      }
      from_local._4_4_ = 2;
    }
    break;
  case (void *)0x74:
    if ((long)vec < 0) {
      return -2;
    }
  case (void *)0x78:
    if (dest != (void *)0x0) {
      *(iovec **)dest = vec;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x75:
    if (((long)vec < 0) || (0xffffffff < (long)vec)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(int *)dest = iVar4;
      }
      from_local._4_4_ = 4;
    }
    break;
  case (void *)0x79:
    if (((long)vec < 0) || (0xff < (long)vec)) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar1;
      }
      from_local._4_4_ = 1;
    }
  }
  return from_local._4_4_;
}

Assistant:

extern int mpt_data_convert_int64(const int64_t *from, MPT_TYPE(type) type, void *dest)
{
	int64_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'b':
			if (val < INT8_MIN || val > INT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int8_t *) dest) = val;
			return sizeof(int8_t);
		case 'y':
			if (val < 0 || val > UINT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint8_t *) dest) = val;
			return sizeof(uint8_t);
		case 'n':
			if (val < INT16_MIN || val > INT16_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int16_t *) dest) = val;
			return sizeof(int16_t);
		case 'q':
			if (val < 0 || val > UINT16_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint16_t *) dest) = val;
			return sizeof(uint16_t);
		case 'i':
			if (val < INT32_MIN || val > INT32_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int32_t *) dest) = val;
			return sizeof(int32_t);
		case 'u':
			if (val < 0 || val > UINT32_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint32_t *) dest) = val;
			return sizeof(uint32_t);
		case 't':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'x':
			if (dest) *((int64_t *) dest) = val;
			return sizeof(int64_t);
		
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(long double);
#endif
		case MPT_type_toVector('x'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
				return sizeof(*vec);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
}